

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riff.cpp
# Opt level: O2

void __thiscall sf2cute::RIFF::RIFF(RIFF *this,string *name)

{
  string local_40;
  
  this->_vptr_RIFF = (_func_int **)&PTR__RIFF_0011d990;
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  (this->name_)._M_string_length = 0;
  (this->name_).field_2._M_local_buf[0] = '\0';
  (this->chunks_).
  super__Vector_base<std::unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>,_std::allocator<std::unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->chunks_).
  super__Vector_base<std::unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>,_std::allocator<std::unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->chunks_).
  super__Vector_base<std::unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>,_std::allocator<std::unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_40,(string *)name);
  set_name(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

RIFF::RIFF(std::string name) {
  set_name(std::move(name));
}